

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

bool tinyusdz::SetPrimElementName(Value *v,string *elementName)

{
  Model *pMVar1;
  Scope *pSVar2;
  Xform *pXVar3;
  GPrim *pGVar4;
  GeomMesh *pGVar5;
  GeomPoints *pGVar6;
  GeomCube *pGVar7;
  GeomCapsule *pGVar8;
  GeomCylinder *pGVar9;
  GeomSphere *pGVar10;
  GeomCone *pGVar11;
  GeomSubset *pGVar12;
  GeomCamera *pGVar13;
  GeomBasisCurves *pGVar14;
  DomeLight *pDVar15;
  SphereLight *pSVar16;
  CylinderLight *pCVar17;
  DiskLight *pDVar18;
  RectLight *pRVar19;
  Material *pMVar20;
  Shader *pSVar21;
  UsdPreviewSurface *pUVar22;
  UsdUVTexture *pUVar23;
  UsdPrimvarReader<int> *pUVar24;
  UsdPrimvarReader<float> *pUVar25;
  UsdPrimvarReader<std::array<float,_2UL>_> *pUVar26;
  UsdPrimvarReader<std::array<float,_3UL>_> *pUVar27;
  UsdPrimvarReader<std::array<float,_4UL>_> *pUVar28;
  UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pUVar29;
  UsdPrimvarReader<tinyusdz::value::normal3f> *pUVar30;
  UsdPrimvarReader<tinyusdz::value::vector3f> *pUVar31;
  UsdPrimvarReader<tinyusdz::value::point3f> *pUVar32;
  UsdPrimvarReader<tinyusdz::value::matrix4d> *pUVar33;
  SkelRoot *pSVar34;
  Skeleton *pSVar35;
  SkelAnimation *pSVar36;
  BlendShape *pBVar37;
  bool ok;
  string *elementName_local;
  Value *v_local;
  
  pMVar1 = value::Value::as<tinyusdz::Model>(v,false);
  if (pMVar1 == (Model *)0x0) {
    pSVar2 = value::Value::as<tinyusdz::Scope>(v,false);
    if (pSVar2 == (Scope *)0x0) {
      pXVar3 = value::Value::as<tinyusdz::Xform>(v,false);
      if (pXVar3 == (Xform *)0x0) {
        pGVar4 = value::Value::as<tinyusdz::GPrim>(v,false);
        if (pGVar4 == (GPrim *)0x0) {
          pGVar5 = value::Value::as<tinyusdz::GeomMesh>(v,false);
          if (pGVar5 == (GeomMesh *)0x0) {
            pGVar6 = value::Value::as<tinyusdz::GeomPoints>(v,false);
            if (pGVar6 == (GeomPoints *)0x0) {
              pGVar7 = value::Value::as<tinyusdz::GeomCube>(v,false);
              if (pGVar7 == (GeomCube *)0x0) {
                pGVar8 = value::Value::as<tinyusdz::GeomCapsule>(v,false);
                if (pGVar8 == (GeomCapsule *)0x0) {
                  pGVar9 = value::Value::as<tinyusdz::GeomCylinder>(v,false);
                  if (pGVar9 == (GeomCylinder *)0x0) {
                    pGVar10 = value::Value::as<tinyusdz::GeomSphere>(v,false);
                    if (pGVar10 == (GeomSphere *)0x0) {
                      pGVar11 = value::Value::as<tinyusdz::GeomCone>(v,false);
                      if (pGVar11 == (GeomCone *)0x0) {
                        pGVar12 = value::Value::as<tinyusdz::GeomSubset>(v,false);
                        if (pGVar12 == (GeomSubset *)0x0) {
                          pGVar13 = value::Value::as<tinyusdz::GeomCamera>(v,false);
                          if (pGVar13 == (GeomCamera *)0x0) {
                            pGVar14 = value::Value::as<tinyusdz::GeomBasisCurves>(v,false);
                            if (pGVar14 == (GeomBasisCurves *)0x0) {
                              pDVar15 = value::Value::as<tinyusdz::DomeLight>(v,false);
                              if (pDVar15 == (DomeLight *)0x0) {
                                pSVar16 = value::Value::as<tinyusdz::SphereLight>(v,false);
                                if (pSVar16 == (SphereLight *)0x0) {
                                  pCVar17 = value::Value::as<tinyusdz::CylinderLight>(v,false);
                                  if (pCVar17 == (CylinderLight *)0x0) {
                                    pDVar18 = value::Value::as<tinyusdz::DiskLight>(v,false);
                                    if (pDVar18 == (DiskLight *)0x0) {
                                      pRVar19 = value::Value::as<tinyusdz::RectLight>(v,false);
                                      if (pRVar19 == (RectLight *)0x0) {
                                        pMVar20 = value::Value::as<tinyusdz::Material>(v,false);
                                        if (pMVar20 == (Material *)0x0) {
                                          pSVar21 = value::Value::as<tinyusdz::Shader>(v,false);
                                          if (pSVar21 == (Shader *)0x0) {
                                            pUVar22 = value::Value::as<tinyusdz::UsdPreviewSurface>
                                                                (v,false);
                                            if (pUVar22 == (UsdPreviewSurface *)0x0) {
                                              pUVar23 = value::Value::as<tinyusdz::UsdUVTexture>
                                                                  (v,false);
                                              if (pUVar23 == (UsdUVTexture *)0x0) {
                                                pUVar24 = value::Value::
                                                          as<tinyusdz::UsdPrimvarReader<int>>
                                                                    (v,false);
                                                if (pUVar24 == (UsdPrimvarReader<int> *)0x0) {
                                                  pUVar25 = value::Value::
                                                            as<tinyusdz::UsdPrimvarReader<float>>
                                                                      (v,false);
                                                  if (pUVar25 == (UsdPrimvarReader<float> *)0x0) {
                                                    pUVar26 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
                                                            (v,false);
                                                  if (pUVar26 ==
                                                      (UsdPrimvarReader<std::array<float,_2UL>_> *)
                                                      0x0) {
                                                    pUVar27 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>
                                                            (v,false);
                                                  if (pUVar27 ==
                                                      (UsdPrimvarReader<std::array<float,_3UL>_> *)
                                                      0x0) {
                                                    pUVar28 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
                                                            (v,false);
                                                  if (pUVar28 ==
                                                      (UsdPrimvarReader<std::array<float,_4UL>_> *)
                                                      0x0) {
                                                    pUVar29 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::__cxx11::string>>
                                                            (v,false);
                                                  if (pUVar29 ==
                                                      (
                                                  UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)0x0) {
                                                    pUVar30 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>>
                                                            (v,false);
                                                  if (pUVar30 ==
                                                      (UsdPrimvarReader<tinyusdz::value::normal3f> *
                                                      )0x0) {
                                                    pUVar31 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>>
                                                            (v,false);
                                                  if (pUVar31 ==
                                                      (UsdPrimvarReader<tinyusdz::value::vector3f> *
                                                      )0x0) {
                                                    pUVar32 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>>
                                                            (v,false);
                                                  if (pUVar32 ==
                                                      (UsdPrimvarReader<tinyusdz::value::point3f> *)
                                                      0x0) {
                                                    pUVar33 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>>
                                                            (v,false);
                                                  if (pUVar33 ==
                                                      (UsdPrimvarReader<tinyusdz::value::matrix4d> *
                                                      )0x0) {
                                                    pSVar34 = value::Value::as<tinyusdz::SkelRoot>
                                                                        (v,false);
                                                    if (pSVar34 == (SkelRoot *)0x0) {
                                                      pSVar35 = value::Value::as<tinyusdz::Skeleton>
                                                                          (v,false);
                                                      if (pSVar35 == (Skeleton *)0x0) {
                                                        pSVar36 = value::Value::
                                                                  as<tinyusdz::SkelAnimation>
                                                                            (v,false);
                                                        if (pSVar36 == (SkelAnimation *)0x0) {
                                                          pBVar37 = value::Value::
                                                                    as<tinyusdz::BlendShape>
                                                                              (v,false);
                                                          if (pBVar37 == (BlendShape *)0x0) {
                                                            return false;
                                                          }
                                                          pBVar37 = value::Value::
                                                                    as<tinyusdz::BlendShape>
                                                                              (v,false);
                                                          std::__cxx11::string::operator=
                                                                    ((string *)pBVar37,
                                                                     (string *)elementName);
                                                        }
                                                        else {
                                                          pSVar36 = value::Value::
                                                                    as<tinyusdz::SkelAnimation>
                                                                              (v,false);
                                                          std::__cxx11::string::operator=
                                                                    ((string *)pSVar36,
                                                                     (string *)elementName);
                                                        }
                                                      }
                                                      else {
                                                        pSVar35 = value::Value::
                                                                  as<tinyusdz::Skeleton>(v,false);
                                                        std::__cxx11::string::operator=
                                                                  ((string *)&pSVar35->name,
                                                                   (string *)elementName);
                                                      }
                                                    }
                                                    else {
                                                      pSVar34 = value::Value::as<tinyusdz::SkelRoot>
                                                                          (v,false);
                                                      std::__cxx11::string::operator=
                                                                ((string *)&pSVar34->name,
                                                                 (string *)elementName);
                                                    }
                                                  }
                                                  else {
                                                    pUVar33 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>>
                                                            (v,false);
                                                  std::__cxx11::string::operator=
                                                            ((string *)pUVar33,(string *)elementName
                                                            );
                                                  }
                                                  }
                                                  else {
                                                    pUVar32 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>>
                                                            (v,false);
                                                  std::__cxx11::string::operator=
                                                            ((string *)pUVar32,(string *)elementName
                                                            );
                                                  }
                                                  }
                                                  else {
                                                    pUVar31 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>>
                                                            (v,false);
                                                  std::__cxx11::string::operator=
                                                            ((string *)pUVar31,(string *)elementName
                                                            );
                                                  }
                                                  }
                                                  else {
                                                    pUVar30 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>>
                                                            (v,false);
                                                  std::__cxx11::string::operator=
                                                            ((string *)pUVar30,(string *)elementName
                                                            );
                                                  }
                                                  }
                                                  else {
                                                    pUVar29 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::__cxx11::string>>
                                                            (v,false);
                                                  std::__cxx11::string::operator=
                                                            ((string *)pUVar29,(string *)elementName
                                                            );
                                                  }
                                                  }
                                                  else {
                                                    pUVar28 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
                                                            (v,false);
                                                  std::__cxx11::string::operator=
                                                            ((string *)pUVar28,(string *)elementName
                                                            );
                                                  }
                                                  }
                                                  else {
                                                    pUVar27 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>
                                                            (v,false);
                                                  std::__cxx11::string::operator=
                                                            ((string *)pUVar27,(string *)elementName
                                                            );
                                                  }
                                                  }
                                                  else {
                                                    pUVar26 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
                                                            (v,false);
                                                  std::__cxx11::string::operator=
                                                            ((string *)pUVar26,(string *)elementName
                                                            );
                                                  }
                                                  }
                                                  else {
                                                    pUVar25 = value::Value::
                                                              as<tinyusdz::UsdPrimvarReader<float>>
                                                                        (v,false);
                                                    std::__cxx11::string::operator=
                                                              ((string *)pUVar25,
                                                               (string *)elementName);
                                                  }
                                                }
                                                else {
                                                  pUVar24 = value::Value::
                                                            as<tinyusdz::UsdPrimvarReader<int>>
                                                                      (v,false);
                                                  std::__cxx11::string::operator=
                                                            ((string *)pUVar24,(string *)elementName
                                                            );
                                                }
                                              }
                                              else {
                                                pUVar23 = value::Value::as<tinyusdz::UsdUVTexture>
                                                                    (v,false);
                                                std::__cxx11::string::operator=
                                                          ((string *)pUVar23,(string *)elementName);
                                              }
                                            }
                                            else {
                                              pUVar22 = value::Value::
                                                        as<tinyusdz::UsdPreviewSurface>(v,false);
                                              std::__cxx11::string::operator=
                                                        ((string *)pUVar22,(string *)elementName);
                                            }
                                          }
                                          else {
                                            pSVar21 = value::Value::as<tinyusdz::Shader>(v,false);
                                            std::__cxx11::string::operator=
                                                      ((string *)pSVar21,(string *)elementName);
                                          }
                                        }
                                        else {
                                          pMVar20 = value::Value::as<tinyusdz::Material>(v,false);
                                          std::__cxx11::string::operator=
                                                    ((string *)pMVar20,(string *)elementName);
                                        }
                                      }
                                      else {
                                        pRVar19 = value::Value::as<tinyusdz::RectLight>(v,false);
                                        std::__cxx11::string::operator=
                                                  ((string *)&(pRVar19->super_BoundableLight).name,
                                                   (string *)elementName);
                                      }
                                    }
                                    else {
                                      pDVar18 = value::Value::as<tinyusdz::DiskLight>(v,false);
                                      std::__cxx11::string::operator=
                                                ((string *)&(pDVar18->super_BoundableLight).name,
                                                 (string *)elementName);
                                    }
                                  }
                                  else {
                                    pCVar17 = value::Value::as<tinyusdz::CylinderLight>(v,false);
                                    std::__cxx11::string::operator=
                                              ((string *)&(pCVar17->super_BoundableLight).name,
                                               (string *)elementName);
                                  }
                                }
                                else {
                                  pSVar16 = value::Value::as<tinyusdz::SphereLight>(v,false);
                                  std::__cxx11::string::operator=
                                            ((string *)&(pSVar16->super_BoundableLight).name,
                                             (string *)elementName);
                                }
                              }
                              else {
                                pDVar15 = value::Value::as<tinyusdz::DomeLight>(v,false);
                                std::__cxx11::string::operator=
                                          ((string *)&(pDVar15->super_NonboundableLight).name,
                                           (string *)elementName);
                              }
                            }
                            else {
                              pGVar14 = value::Value::as<tinyusdz::GeomBasisCurves>(v,false);
                              std::__cxx11::string::operator=
                                        ((string *)&(pGVar14->super_GPrim).name,
                                         (string *)elementName);
                            }
                          }
                          else {
                            pGVar13 = value::Value::as<tinyusdz::GeomCamera>(v,false);
                            std::__cxx11::string::operator=
                                      ((string *)&(pGVar13->super_GPrim).name,(string *)elementName)
                            ;
                          }
                        }
                        else {
                          pGVar12 = value::Value::as<tinyusdz::GeomSubset>(v,false);
                          std::__cxx11::string::operator=
                                    ((string *)&pGVar12->name,(string *)elementName);
                        }
                      }
                      else {
                        pGVar11 = value::Value::as<tinyusdz::GeomCone>(v,false);
                        std::__cxx11::string::operator=
                                  ((string *)&(pGVar11->super_GPrim).name,(string *)elementName);
                      }
                    }
                    else {
                      pGVar10 = value::Value::as<tinyusdz::GeomSphere>(v,false);
                      std::__cxx11::string::operator=
                                ((string *)&(pGVar10->super_GPrim).name,(string *)elementName);
                    }
                  }
                  else {
                    pGVar9 = value::Value::as<tinyusdz::GeomCylinder>(v,false);
                    std::__cxx11::string::operator=
                              ((string *)&(pGVar9->super_GPrim).name,(string *)elementName);
                  }
                }
                else {
                  pGVar8 = value::Value::as<tinyusdz::GeomCapsule>(v,false);
                  std::__cxx11::string::operator=
                            ((string *)&(pGVar8->super_GPrim).name,(string *)elementName);
                }
              }
              else {
                pGVar7 = value::Value::as<tinyusdz::GeomCube>(v,false);
                std::__cxx11::string::operator=
                          ((string *)&(pGVar7->super_GPrim).name,(string *)elementName);
              }
            }
            else {
              pGVar6 = value::Value::as<tinyusdz::GeomPoints>(v,false);
              std::__cxx11::string::operator=
                        ((string *)&(pGVar6->super_GPrim).name,(string *)elementName);
            }
          }
          else {
            pGVar5 = value::Value::as<tinyusdz::GeomMesh>(v,false);
            std::__cxx11::string::operator=
                      ((string *)&(pGVar5->super_GPrim).name,(string *)elementName);
          }
        }
        else {
          pGVar4 = value::Value::as<tinyusdz::GPrim>(v,false);
          std::__cxx11::string::operator=((string *)&pGVar4->name,(string *)elementName);
        }
      }
      else {
        pXVar3 = value::Value::as<tinyusdz::Xform>(v,false);
        std::__cxx11::string::operator=((string *)&(pXVar3->super_GPrim).name,(string *)elementName)
        ;
      }
    }
    else {
      pSVar2 = value::Value::as<tinyusdz::Scope>(v,false);
      std::__cxx11::string::operator=((string *)&pSVar2->name,(string *)elementName);
    }
  }
  else {
    pMVar1 = value::Value::as<tinyusdz::Model>(v,false);
    std::__cxx11::string::operator=((string *)&pMVar1->name,(string *)elementName);
  }
  return true;
}

Assistant:

bool SetPrimElementName(value::Value &v, const std::string &elementName) {
  // Lookup name field of Prim class
  bool ok{false};

#define SET_ELEMENT_NAME(__name, __ty) \
  if (v.as<__ty>()) {                  \
    v.as<__ty>()->name = __name;       \
    ok = true;                         \
  } else

  SET_ELEMENT_NAME(elementName, Model)
  SET_ELEMENT_NAME(elementName, Scope)
  SET_ELEMENT_NAME(elementName, Xform)
  SET_ELEMENT_NAME(elementName, GPrim)
  SET_ELEMENT_NAME(elementName, GeomMesh)
  SET_ELEMENT_NAME(elementName, GeomPoints)
  SET_ELEMENT_NAME(elementName, GeomCube)
  SET_ELEMENT_NAME(elementName, GeomCapsule)
  SET_ELEMENT_NAME(elementName, GeomCylinder)
  SET_ELEMENT_NAME(elementName, GeomSphere)
  SET_ELEMENT_NAME(elementName, GeomCone)
  SET_ELEMENT_NAME(elementName, GeomSubset)
  SET_ELEMENT_NAME(elementName, GeomCamera)
  SET_ELEMENT_NAME(elementName, GeomBasisCurves)
  SET_ELEMENT_NAME(elementName, DomeLight)
  SET_ELEMENT_NAME(elementName, SphereLight)
  SET_ELEMENT_NAME(elementName, CylinderLight)
  SET_ELEMENT_NAME(elementName, DiskLight)
  SET_ELEMENT_NAME(elementName, RectLight)
  SET_ELEMENT_NAME(elementName, Material)
  SET_ELEMENT_NAME(elementName, Shader)
  // TODO: set element name must be handled in Shader class
  SET_ELEMENT_NAME(elementName, UsdPreviewSurface)
  SET_ELEMENT_NAME(elementName, UsdUVTexture)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_int)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_float)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_float2)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_float3)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_float4)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_string)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_normal)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_vector)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_point)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_matrix)
  //
  SET_ELEMENT_NAME(elementName, SkelRoot)
  SET_ELEMENT_NAME(elementName, Skeleton)
  SET_ELEMENT_NAME(elementName, SkelAnimation)
  SET_ELEMENT_NAME(elementName, BlendShape) { return false; }

#undef SET_ELEMENT_NAME

  return ok;
}